

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::Print<char>::operator()
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Print<char> *this,mode *first,int *args,char (*args_1) [7])

{
  int iVar1;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*first == str) {
    if (operator()<int,char_const(&)[7]>(ptc::mode&&,int&&,char_const&[])::oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<int,char_const(&)[7]>(ptc::mode&&,int&&,char_const&[])
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &operator()<int,char_const(&)[7]>(ptc::mode&&,int&&,char_const&[])::
                    oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                     &operator()<int,char_const(&)[7]>(ptc::mode&&,int&&,char_const&[])::
                      oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<int,char_const(&)[7]>(ptc::mode&&,int&&,char_const&[])::
                             oss_abi_cxx11_);
      }
    }
    s_abi_cxx11_(&local_48,"",0);
    std::__cxx11::stringbuf::str((string *)&DAT_00153a80);
    std::__cxx11::string::~string((string *)&local_48);
    std::ios::clear((int)*(undefined8 *)
                          (operator()<int,char_const(&)[7]>(ptc::mode&&,int&&,char_const&[])::
                           oss_abi_cxx11_ + -0x18) + 0x153a78);
    print_backend<std::__cxx11::ostringstream&,int,char_const(&)[7]>
              (this,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &operator()<int,char_const(&)[7]>(ptc::mode&&,int&&,char_const&[])::
                     oss_abi_cxx11_,args,args_1);
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }